

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O2

void vkt::sparse::addBufferSparseMemoryAliasingTests(TestCaseGroup *group)

{
  TestContext *pTVar1;
  BufferSparseMemoryAliasingCase *pBVar2;
  GLSLVersion in_R9D;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_10",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar1,&local_40,&local_60,0x400,in_R9D);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_12",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar1,&local_40,&local_60,0x1000,in_R9D);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_16",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar1,&local_40,&local_60,0x10000,in_R9D);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_17",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar1,&local_40,&local_60,0x20000,in_R9D);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_20",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar1,&local_40,&local_60,0x100000,in_R9D);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pBVar2 = (BufferSparseMemoryAliasingCase *)operator_new(0x78);
  pTVar1 = (group->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"buffer_size_2_24",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
  anon_unknown_0::BufferSparseMemoryAliasingCase::BufferSparseMemoryAliasingCase
            (pBVar2,pTVar1,&local_40,&local_60,0x1000000,in_R9D);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void addBufferSparseMemoryAliasingTests(tcu::TestCaseGroup* group)
{
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_10", "", 1 << 10, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_12", "", 1 << 12, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_16", "", 1 << 16, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_17", "", 1 << 17, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_20", "", 1 << 20, glu::GLSL_VERSION_440));
	group->addChild(new BufferSparseMemoryAliasingCase(group->getTestContext(), "buffer_size_2_24", "", 1 << 24, glu::GLSL_VERSION_440));
}